

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureQueryLodInstance *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  Vec4 output;
  allocator<char> local_1c1;
  float local_1c0;
  float local_1bc;
  undefined1 local_1b8 [16];
  MessageBuilder local_1a8;
  
  pTVar2 = ((this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.super_TestInstance.
           m_context)->m_testCtx->m_log;
  poVar1 = &local_1a8.m_str;
  local_1a8.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Expected: level in range ");
  tcu::operator<<((ostream *)poVar1,&this->m_levelBounds);
  std::operator<<((ostream *)poVar1,", lod in range ");
  tcu::operator<<((ostream *)poVar1,&this->m_lodBounds);
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  TextureQueryInstance::render(&this->super_TextureQueryInstance);
  tcu::TextureLevel::getAccess
            ((ConstPixelBufferAccess *)&local_1a8,
             &(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_resultImage);
  tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_1b8,(int)&local_1a8,0,0);
  local_1c0 = (float)local_1b8._4_4_;
  if (((((float)local_1b8._0_4_ < (this->m_levelBounds).m_data[0]) ||
       ((this->m_levelBounds).m_data[1] < (float)local_1b8._0_4_)) ||
      ((float)local_1b8._4_4_ < (this->m_lodBounds).m_data[0])) ||
     ((this->m_lodBounds).m_data[1] < (float)local_1b8._4_4_)) {
    local_1bc = (float)local_1b8._0_4_;
    poVar1 = &local_1a8.m_str;
    local_1a8.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Result: level: ");
    std::ostream::operator<<(poVar1,local_1bc);
    std::operator<<((ostream *)poVar1,", lod: ");
    std::ostream::operator<<(poVar1,local_1c0);
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    poVar1 = &local_1a8.m_str;
    local_1a8.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Failed");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Got unexpected result",&local_1c1);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_1a8);
  }
  else {
    poVar1 = &local_1a8.m_str;
    local_1a8.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Passed");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Pass",&local_1c1);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_1a8);
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureQueryLodInstance::iterate (void)
{
	tcu::TestLog&		log		= m_context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Expected: level in range " << m_levelBounds << ", lod in range " << m_lodBounds << tcu::TestLog::EndMessage;

	// render
	TextureQueryInstance::render();

	// test
	{
		const tcu::TextureLevel&	result		= getResultImage();
		const tcu::Vec4				output		= result.getAccess().getPixel(0, 0);
		const float					resLevel	= output.x();
		const float					resLod		= output.y();

		if (de::inRange(resLevel, m_levelBounds[0], m_levelBounds[1]) && de::inRange(resLod, m_lodBounds[0], m_lodBounds[1]))
		{
			// success
			log << tcu::TestLog::Message << "Passed" << tcu::TestLog::EndMessage;
			return tcu::TestStatus::pass("Pass");
		}
		else
		{
			// failure
			log << tcu::TestLog::Message << "Result: level: " << resLevel << ", lod: " << resLod << tcu::TestLog::EndMessage;
			log << tcu::TestLog::Message << "Failed" << tcu::TestLog::EndMessage;
			return tcu::TestStatus::fail("Got unexpected result");
		}
	}
}